

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qheaderview.cpp
# Opt level: O2

void __thiscall QHeaderView::swapSections(QHeaderView *this,int first,int second)

{
  uint uVar1;
  QHeaderViewPrivate *this_00;
  long lVar2;
  Data *pDVar3;
  SectionItem *pSVar4;
  bool hidden;
  int iVar5;
  ResizeMode mode;
  int sizePerSection;
  ResizeMode mode_00;
  pointer piVar6;
  bool hidden_00;
  int local_5c;
  int local_58;
  
  if (first != second) {
    this_00 = *(QHeaderViewPrivate **)
               &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget
                .field_0x8;
    QAbstractItemViewPrivate::executePostedLayout(&this_00->super_QAbstractItemViewPrivate);
    if (-1 < first) {
      if (this_00->headerMode == InitialNoSectionMemoryUsage) {
        uVar1 = (uint)this_00->countInNoSectionItemsMode;
        if ((second < 0 || (int)uVar1 <= first) || uVar1 <= (uint)second) {
          return;
        }
        QHeaderViewPrivate::switchToFlexibleModeWithSectionMemoryUsage(this_00);
      }
      else {
        uVar1 = (uint)(this_00->sectionItems).d.size;
        if ((second < 0 || (int)uVar1 <= first) || uVar1 <= (uint)second) {
          return;
        }
      }
      iVar5 = QHeaderViewPrivate::headerSectionSize(this_00,first);
      mode = QHeaderViewPrivate::headerSectionResizeMode(this_00,first);
      lVar2 = (this_00->logicalIndices).d.size;
      local_58 = first;
      if (lVar2 != 0) {
        local_58 = (this_00->logicalIndices).d.ptr[(uint)first];
      }
      sizePerSection = QHeaderViewPrivate::headerSectionSize(this_00,second);
      mode_00 = QHeaderViewPrivate::headerSectionResizeMode(this_00,second);
      local_5c = second;
      if (lVar2 != 0) {
        local_5c = (this_00->logicalIndices).d.ptr[(uint)second];
      }
      if (this_00->state == ResizeSection) {
        this_00->preventCursorChangeInSetOffset = true;
      }
      QHeaderViewPrivate::createSectionItems(this_00,second,second,iVar5,mode);
      QHeaderViewPrivate::createSectionItems(this_00,first,first,sizePerSection,mode_00);
      QHeaderViewPrivate::initializeIndexMapping(this_00);
      piVar6 = QList<int>::data(&this_00->visualIndices);
      piVar6[local_58] = second;
      piVar6 = QList<int>::data(&this_00->logicalIndices);
      piVar6[(uint)second] = local_58;
      piVar6 = QList<int>::data(&this_00->visualIndices);
      piVar6[local_5c] = first;
      piVar6 = QList<int>::data(&this_00->logicalIndices);
      piVar6[(uint)first] = local_5c;
      pDVar3 = (this_00->hiddenSectionSize).d;
      if ((pDVar3 != (Data *)0x0) && (pDVar3->size != 0)) {
        if (this_00->headerMode == InitialNoSectionMemoryUsage) {
          hidden_00 = false;
          hidden = false;
        }
        else {
          pSVar4 = (this_00->sectionItems).d.ptr;
          hidden_00 = (bool)((pSVar4[(uint)first].field_0x2 & 0x10) >> 4);
          hidden = (bool)((pSVar4[(uint)second].field_0x2 & 0x10) >> 4);
        }
        QHeaderViewPrivate::setVisualIndexHidden(this_00,first,hidden);
        QHeaderViewPrivate::setVisualIndexHidden(this_00,second,hidden_00);
      }
      QWidget::update((this_00->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                      viewport);
      sectionMoved(this,local_58,first,second);
      sectionMoved(this,local_5c,second,first);
      if ((*(char *)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                               super_QFrame.super_QWidget.field_0x8 + 0x5ec) == '\x01') &&
         (iVar5 = visualIndex(this,this_00->lastSectionLogicalIdx),
         iVar5 <= first || iVar5 <= second)) {
        QHeaderViewPrivate::maybeRestorePrevLastSectionAndStretchLast(this_00);
        return;
      }
    }
  }
  return;
}

Assistant:

void QHeaderView::swapSections(int first, int second)
{
    Q_D(QHeaderView);

    if (first == second)
        return;
    d->executePostedLayout();
    if (first < 0 || first >= d->sectionCount() || second < 0 || second >= d->sectionCount())
        return;

    if (d->noSectionMemoryUsage())
        d->switchToFlexibleModeWithSectionMemoryUsage();

    int firstSize = d->headerSectionSize(first);
    ResizeMode firstMode = d->headerSectionResizeMode(first);
    int firstLogical = d->logicalIndex(first);

    int secondSize = d->headerSectionSize(second);
    ResizeMode secondMode = d->headerSectionResizeMode(second);
    int secondLogical = d->logicalIndex(second);

    if (d->state == QHeaderViewPrivate::ResizeSection)
        d->preventCursorChangeInSetOffset = true;

    d->createSectionItems(second, second, firstSize, firstMode);
    d->createSectionItems(first, first, secondSize, secondMode);

    d->initializeIndexMapping();

    d->visualIndices[firstLogical] = second;
    d->logicalIndices[second] = firstLogical;

    d->visualIndices[secondLogical] = first;
    d->logicalIndices[first] = secondLogical;

    if (!d->hiddenSectionSize.isEmpty()) {
        bool firstHidden = d->isVisualIndexHidden(first);
        bool secondHidden = d->isVisualIndexHidden(second);
        d->setVisualIndexHidden(first, secondHidden);
        d->setVisualIndexHidden(second, firstHidden);
    }

    d->viewport->update();
    emit sectionMoved(firstLogical, first, second);
    emit sectionMoved(secondLogical, second, first);

    if (stretchLastSection()) {
        const int lastSectionVisualIdx = visualIndex(d->lastSectionLogicalIdx);
        if (first >= lastSectionVisualIdx || second >= lastSectionVisualIdx)
            d->maybeRestorePrevLastSectionAndStretchLast();
    }
}